

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModelValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)300>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  Type *pTVar2;
  GLMRegressor *from;
  Type *pTVar3;
  int i;
  int iVar4;
  int index;
  ModelDescription *description;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  allocator_type local_dd;
  TypeCase local_dc [3];
  Result *local_d0;
  string local_c8;
  Model *local_a8;
  Result result;
  GLMRegressor lr;
  
  description = format->description_;
  if (description == (ModelDescription *)0x0) {
    description = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  validateRegressorInterface(&result,description,format->specificationversion_);
  bVar1 = Result::good(&result);
  if (bVar1) {
    iVar4 = 0;
    local_d0 = __return_storage_ptr__;
    local_a8 = format;
    do {
      if ((description->input_).super_RepeatedPtrFieldBase.current_size_ <= iVar4) {
        iVar4 = 0;
        goto LAB_002108ff;
      }
      local_dc[0] = kDoubleType;
      local_dc[1] = kMultiArrayType;
      local_dc[2] = 1;
      __l._M_len = 3;
      __l._M_array = local_dc;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)&local_c8,__l,&local_dd);
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&(description->input_).super_RepeatedPtrFieldBase,iVar4);
      validateSchemaTypes((Result *)&lr,
                          (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                           *)&local_c8,pTVar2);
      Result::operator=(&result,(Result *)&lr);
      std::__cxx11::string::~string((string *)&lr._internal_metadata_);
      std::
      _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                       *)&local_c8);
      bVar1 = Result::good(&result);
      iVar4 = iVar4 + 1;
      __return_storage_ptr__ = local_d0;
    } while (bVar1);
  }
  goto LAB_00210973;
  while( true ) {
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::TypeHandler>
                       (&lr.weights_.super_RepeatedPtrFieldBase,index);
    index = index + 1;
    if ((pTVar3->value_).current_size_ != iVar4) break;
LAB_002109e7:
    if (lr.weights_.super_RepeatedPtrFieldBase.current_size_ <= index) goto LAB_00210a5c;
  }
  std::__cxx11::string::string
            ((string *)&local_c8,"All weight coefficients must be the same size.",
             (allocator *)local_dc);
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_c8);
LAB_00210a50:
  std::__cxx11::string::~string((string *)&local_c8);
LAB_00210a64:
  Specification::GLMRegressor::~GLMRegressor(&lr);
  goto LAB_0021097b;
LAB_00210a5c:
  Result::Result(__return_storage_ptr__);
  goto LAB_00210a64;
  while( true ) {
    local_dc[0] = 2;
    __l_00._M_len = 1;
    __l_00._M_array = local_dc;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_c8,__l_00,&local_dd);
    pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&(description->output_).super_RepeatedPtrFieldBase,iVar4);
    validateSchemaTypes((Result *)&lr,
                        (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                         *)&local_c8,pTVar2);
    Result::operator=(&result,(Result *)&lr);
    std::__cxx11::string::~string((string *)&lr._internal_metadata_);
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base((_Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                     *)&local_c8);
    bVar1 = Result::good(&result);
    iVar4 = iVar4 + 1;
    __return_storage_ptr__ = local_d0;
    if (!bVar1) break;
LAB_002108ff:
    if ((description->output_).super_RepeatedPtrFieldBase.current_size_ <= iVar4) {
      from = Specification::Model::glmregressor(local_a8);
      Specification::GLMRegressor::GLMRegressor(&lr,from);
      __return_storage_ptr__ = local_d0;
      if (lr.weights_.super_RepeatedPtrFieldBase.current_size_ != lr.offset_.current_size_) {
        std::__cxx11::string::string
                  ((string *)&local_c8,"Weights and offsets must be the same size.",
                   (allocator *)local_dc);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_c8);
        goto LAB_00210a50;
      }
      if (lr.weights_.super_RepeatedPtrFieldBase.current_size_ < 1) goto LAB_00210a5c;
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::TypeHandler>
                         (&lr.weights_.super_RepeatedPtrFieldBase,0);
      iVar4 = (pTVar3->value_).current_size_;
      index = 1;
      goto LAB_002109e7;
    }
  }
LAB_00210973:
  Result::Result(__return_storage_ptr__,&result);
LAB_0021097b:
  std::__cxx11::string::~string((string *)&result.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_glmRegressor>(const Specification::Model& format) {
        const Specification::ModelDescription& interface = format.description();

        // Must have a regressor interface (since GLMRegressor is an MLRegressor)
        Result result = validateRegressorInterface(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // Check allowed output input & types are supported by this model.
        for (int i = 0; i < interface.input_size(); i++) {
            result = validateSchemaTypes({
                            Specification::FeatureType::kDoubleType,
                            Specification::FeatureType::kMultiArrayType,
                            Specification::FeatureType::kInt64Type
                      }, interface.input(i));
            if (!result.good()) {
                return result;
            }
        }
        for (int i = 0; i < interface.output_size(); i++) {
            result = validateSchemaTypes({
                Specification::FeatureType::kDoubleType,
            }, interface.output(i));

            if (!result.good()) {
                return result;
            }
        }
        
        // Linear regression specific type checking.
        // -------------------------------------------------------------------------
        auto lr = format.glmregressor();
        if (lr.weights_size() != lr.offset_size()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Weights and offsets must be the same size.");
        }
        
        if (lr.weights_size() > 0) {
            int expected_size = lr.weights(0).value_size();
            for (int i = 1; i < lr.weights_size(); i++) {
                if (lr.weights(i).value_size() != expected_size) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "All weight coefficients must be the same size.");
                }
            }
        }
        return Result();
    }